

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O0

void __thiscall RedBlackTree::insertElement(RedBlackTree *this,int value)

{
  Node *pNVar1;
  Node *local_20;
  Node *node;
  RedBlackTree *pRStack_10;
  int value_local;
  RedBlackTree *this_local;
  
  node._4_4_ = value;
  pRStack_10 = this;
  pNVar1 = (Node *)operator_new(0x20);
  Node::Node(pNVar1,node._4_4_);
  local_20 = pNVar1;
  pNVar1 = insert(this,&this->root,&local_20);
  this->root = pNVar1;
  fixInsert(this,&local_20);
  return;
}

Assistant:

void RedBlackTree::insertElement(int value) {
    auto *node = new Node(value);
    root = insert(root, node);
    fixInsert(node);
}